

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall Utest::run(Utest *this)

{
  int iVar1;
  OutsideTestRunnerUTest *pOVar2;
  
  pOVar2 = (OutsideTestRunnerUTest *)UtestShell::currentTest_;
  if (UtestShell::currentTest_ == (UtestShell *)0x0) {
    OutsideTestRunnerUTest::instance();
    pOVar2 = &OutsideTestRunnerUTest::instance::instance_;
  }
  (*(pOVar2->super_UtestShell)._vptr_UtestShell[0x1e])(pOVar2,"\n-------- before setup: ");
  iVar1 = (*PlatformSpecificSetJmp)(helperDoTestSetup,this);
  (*(pOVar2->super_UtestShell)._vptr_UtestShell[0x1e])(pOVar2,"\n-------- after  setup: ");
  if (iVar1 != 0) {
    (*(pOVar2->super_UtestShell)._vptr_UtestShell[0x1e])(pOVar2,"\n----------  before body: ");
    (*PlatformSpecificSetJmp)(helperDoTestBody,this);
    (*(pOVar2->super_UtestShell)._vptr_UtestShell[0x1e])(pOVar2,"\n----------  after body: ");
  }
  (*(pOVar2->super_UtestShell)._vptr_UtestShell[0x1e])(pOVar2,"\n--------  before teardown: ");
  (*PlatformSpecificSetJmp)(helperDoTestTeardown,this);
  (*(pOVar2->super_UtestShell)._vptr_UtestShell[0x1e])(pOVar2,"\n--------  after teardown: ");
  return;
}

Assistant:

void Utest::run()
{
    UtestShell* current = UtestShell::getCurrent();
    int jumpResult = 0;
    try {
        current->printVeryVerbose("\n-------- before setup: ");
        jumpResult = PlatformSpecificSetJmp(helperDoTestSetup, this);
        current->printVeryVerbose("\n-------- after  setup: ");

        if (jumpResult) {
            current->printVeryVerbose("\n----------  before body: ");
            PlatformSpecificSetJmp(helperDoTestBody, this);
            current->printVeryVerbose("\n----------  after body: ");
        }
    }
    catch (CppUTestFailedException&)
    {
        PlatformSpecificRestoreJumpBuffer();
    }

    try {
        current->printVeryVerbose("\n--------  before teardown: ");
        PlatformSpecificSetJmp(helperDoTestTeardown, this);
        current->printVeryVerbose("\n--------  after teardown: ");
    }
    catch (CppUTestFailedException&)
    {
        PlatformSpecificRestoreJumpBuffer();
    }

}